

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

int __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetRepeatedEnumValue
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index)

{
  Type TVar1;
  uint32 uVar2;
  int iVar3;
  RepeatedField<int> *this_00;
  int *piVar4;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedEnumValue","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedEnumValue",
               "Field is singular; the method requires a repeated field.");
  }
  TVar1 = FieldDescriptor::type(field);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar1 * 4) != 8) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetRepeatedEnumValue",CPPTYPE_ENUM);
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar2 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    iVar3 = ExtensionSet::GetRepeatedEnum
                      ((ExtensionSet *)
                       ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                       *(int *)(field + 0x38),index);
    return iVar3;
  }
  this_00 = GetRaw<google::protobuf::RepeatedField<int>>(this,message,field);
  piVar4 = RepeatedField<int>::Get(this_00,index);
  return *piVar4;
}

Assistant:

int GeneratedMessageReflection::GetRepeatedEnumValue(
    const Message& message, const FieldDescriptor* field, int index) const {
  USAGE_CHECK_ALL(GetRepeatedEnumValue, REPEATED, ENUM);

  int value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetRepeatedEnum(field->number(), index);
  } else {
    value = GetRepeatedField<int>(message, field, index);
  }
  return value;
}